

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

void __thiscall leveldb::MemTableIterator::SeekToLast(MemTableIterator *this)

{
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *pSVar1;
  bool bVar2;
  Node *pNVar3;
  Node *pNVar4;
  int iVar5;
  Node *in_RDX;
  
  pSVar1 = (this->iter_).list_;
  iVar5 = (pSVar1->max_height_).super___atomic_base<int>._M_i + -1;
  pNVar3 = pSVar1->head_;
  do {
    pNVar4 = pNVar3->next_[iVar5]._M_b._M_p;
    bVar2 = true;
    if (pNVar4 == (Node *)0x0) {
      pNVar4 = pNVar3;
      if (iVar5 == 0) {
        iVar5 = 0;
        bVar2 = false;
        in_RDX = pNVar3;
      }
      else {
        iVar5 = iVar5 + -1;
      }
    }
    pNVar3 = pNVar4;
  } while (bVar2);
  (this->iter_).node_ = in_RDX;
  pNVar3 = (Node *)0x0;
  if (in_RDX != ((this->iter_).list_)->head_) {
    pNVar3 = in_RDX;
  }
  (this->iter_).node_ = pNVar3;
  return;
}

Assistant:

inline void SkipList<Key, Comparator>::Iterator::SeekToLast() {
  node_ = list_->FindLast();
  if (node_ == list_->head_) {
    node_ = nullptr;
  }
}